

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random-solver.cpp
# Opt level: O2

bool __thiscall
baryonyx::itm::
solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
          (solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
           *this,bit_array *x,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> last,double kappa,
          double delta,double theta)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  _Head_base<0UL,_int_*,_false> _Var9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  row_iterator prVar13;
  int iVar14;
  long lVar15;
  _Head_base<0UL,_int_*,_false> _Var16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 in_XMM3_Qb;
  undefined1 local_90 [16];
  _Head_base<0UL,_int_*,_false> local_80;
  long local_78;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false> local_70;
  solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>
  *local_68;
  _Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false> local_60;
  int *local_58;
  int *local_50;
  long local_48;
  _Head_base<0UL,_int_*,_false> local_40;
  int *local_38;
  
  local_68 = this + 8;
  dVar20 = kappa / (1.0 - kappa);
  local_60._M_head_impl = (col_value *)theta;
  local_58 = last._M_current;
  do {
    if (first._M_current == local_58) {
      return false;
    }
    if (*(int *)(this + 0x80) <= *first._M_current) {
      details::fail_fast("Precondition","k < m",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"186");
    }
    iVar12 = (int)local_68;
    local_78 = (long)*first._M_current;
    local_50 = first._M_current;
    sparse_matrix<int>::row((sparse_matrix<int> *)local_90,iVar12);
    solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
    ::decrease_preference
              ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                *)this,(row_iterator)local_90._8_8_,(row_iterator)local_90._0_8_,
               (double)local_60._M_head_impl);
    _Var16._M_head_impl = (int *)0x0;
    for (_Var9._M_head_impl = (int *)local_90._8_8_; _Var9._M_head_impl != (int *)local_90._0_8_;
        _Var9._M_head_impl = _Var9._M_head_impl + 2) {
      sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,iVar12);
      lVar17 = *(long *)(this + 0x48);
      auVar27 = ZEXT816(0) << 0x40;
      while (local_38 != local_40._M_head_impl) {
        iVar14 = *local_38;
        local_38 = local_38 + 2;
        auVar22._0_8_ = (double)*(int *)(lVar17 + (long)iVar14 * 4);
        auVar22._8_8_ = in_XMM3_Qb;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(*(long *)(this + 0x68) + (long)iVar14 * 8);
        auVar27 = vfmadd231sd_fma(auVar27,auVar22,auVar2);
      }
      lVar10 = *(long *)(this + 0x50);
      lVar15 = (long)_Var16._M_head_impl * 0x10;
      *(int *)(lVar10 + 8 + lVar15) = (int)_Var16._M_head_impl;
      *(undefined4 *)(lVar10 + 0xc + lVar15) =
           *(undefined4 *)(lVar17 + (long)*_Var9._M_head_impl * 4);
      dVar21 = quadratic_cost_type<double>::operator()
                         (*(quadratic_cost_type<double> **)(this + 0x70),
                          *(int *)(local_90._8_8_ + 4),x);
      *(double *)(*(long *)(this + 0x50) + lVar15) = dVar21 - auVar27._0_8_;
      _Var16._M_head_impl = _Var16._M_head_impl + 1;
    }
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>::rc_data*>
              (*(rc_data **)(this + 0x50),
               *(rc_data **)(this + 0x50) + ((ulong)_Var16._M_head_impl & 0xffffffff),
               *(random_engine **)this);
    local_70._M_head_impl = (row_value *)(local_78 * 0xc);
    lVar17 = *(long *)(this + 0x58);
    if (*(int *)(lVar17 + (long)local_70._M_head_impl) < 1) {
      iVar12 = 0;
      uVar19 = 0xffffffffffffffff;
LAB_00167602:
      iVar14 = (int)_Var16._M_head_impl;
      bVar8 = iVar12 <= *(int *)((long)&(local_70._M_head_impl)->column + lVar17);
    }
    else {
      lVar18 = -0x100000000;
      lVar15 = 0;
      local_48 = (long)((int)_Var16._M_head_impl + -2);
      lVar17 = *(long *)(this + 0x50);
      iVar12 = 0;
      lVar10 = -1;
      local_80._M_head_impl = _Var16._M_head_impl;
      do {
        uVar7 = local_90._8_8_;
        iVar12 = iVar12 + *(int *)(lVar17 + 0xc + lVar15);
        lVar18 = lVar18 + 0x100000000;
        iVar14 = *(int *)(lVar17 + 8 + lVar15);
        iVar6 = *(int *)((long)&(local_70._M_head_impl)->value + *(long *)(this + 0x58));
        bit_array_impl::set(&x->super_bit_array_impl,
                            ((row_iterator)(local_90._8_8_ + (long)iVar14 * 8))->column);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar20;
        lVar17 = *(long *)(this + 0x50);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = delta;
        auVar23._8_8_ = 0;
        auVar23._0_8_ = *(double *)(lVar17 + lVar15) * 0.5;
        auVar27 = vfmadd213sd_fma(auVar23,auVar28,auVar27);
        *(double *)
         (*(long *)(this + 0x68) + (long)((row_iterator)(uVar7 + (long)iVar14 * 8))->value * 8) =
             auVar27._0_8_ +
             *(double *)
              (*(long *)(this + 0x68) + (long)((row_iterator)(uVar7 + (long)iVar14 * 8))->value * 8)
        ;
        if (iVar6 <= iVar12) break;
        lVar15 = lVar15 + 0x10;
        bVar8 = lVar10 < local_48;
        lVar10 = lVar10 + 1;
      } while (bVar8);
      lVar17 = *(long *)(this + 0x58);
      uVar19 = lVar18 >> 0x20;
      _Var16._M_head_impl = local_80._M_head_impl;
      if (*(int *)(lVar17 + (long)local_70._M_head_impl) <= iVar12) goto LAB_00167602;
      iVar14 = (int)local_80._M_head_impl;
      bVar8 = false;
    }
    lVar17 = uVar19 << 4;
    uVar11 = uVar19;
    while( true ) {
      uVar11 = uVar11 + 1;
      uVar19 = uVar19 + 1;
      if (((ulong)(long)iVar14 <= uVar19) || (!bVar8)) break;
      lVar10 = *(long *)(this + 0x50);
      iVar12 = iVar12 + *(int *)(lVar10 + 0x1c + lVar17);
      if (iVar12 < *(int *)((long)&(local_70._M_head_impl)->value + *(long *)(this + 0x58))) {
        prVar13 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar10 + 0x18 + lVar17) * 8);
LAB_001676c4:
        bit_array_impl::unset(&x->super_bit_array_impl,prVar13->column);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = dVar20;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = delta;
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar17) * 0.5;
        auVar27 = vfmadd213sd_fma(auVar25,auVar30,auVar4);
        *(double *)(*(long *)(this + 0x68) + (long)prVar13->value * 8) =
             *(double *)(*(long *)(this + 0x68) + (long)prVar13->value * 8) - auVar27._0_8_;
        bVar8 = false;
      }
      else {
        prVar13 = (row_iterator)(local_90._8_8_ + (long)*(int *)(lVar10 + 0x18 + lVar17) * 8);
        if ((*(int *)((long)&(local_70._M_head_impl)->column + *(long *)(this + 0x58)) < iVar12) ||
           (bVar8 = stop_iterating<baryonyx::itm::maximize_tag,double>
                              (*(double *)(lVar10 + 0x10 + lVar17),*(random_engine **)this), !bVar8)
           ) goto LAB_001676c4;
        bit_array_impl::set(&x->super_bit_array_impl,prVar13->column);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar20;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = delta;
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(double *)(*(long *)(this + 0x50) + 0x10 + lVar17) * 0.5;
        auVar27 = vfmadd213sd_fma(auVar24,auVar29,auVar3);
        *(double *)(*(long *)(this + 0x68) + (long)prVar13->value * 8) =
             auVar27._0_8_ + *(double *)(*(long *)(this + 0x68) + (long)prVar13->value * 8);
        bVar8 = true;
      }
      lVar17 = lVar17 + 0x10;
    }
    while (uVar7 = local_90._8_8_, uVar11 < (ulong)(long)iVar14) {
      iVar12 = *(int *)(*(long *)(this + 0x50) + 0x18 + lVar17);
      bit_array_impl::unset
                (&x->super_bit_array_impl,
                 ((row_iterator)(local_90._8_8_ + (long)iVar12 * 8))->column);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar20;
      uVar11 = uVar11 + 1;
      pdVar1 = (double *)(*(long *)(this + 0x50) + 0x10 + lVar17);
      lVar17 = lVar17 + 0x10;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = delta;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *pdVar1 * 0.5;
      auVar27 = vfmadd213sd_fma(auVar26,auVar31,auVar5);
      *(double *)
       (*(long *)(this + 0x68) + (long)((row_iterator)(uVar7 + (long)iVar12 * 8))->value * 8) =
           *(double *)
            (*(long *)(this + 0x68) + (long)((row_iterator)(uVar7 + (long)iVar12 * 8))->value * 8) -
           auVar27._0_8_;
    }
    bVar8 = is_valid_constraint<baryonyx::itm::solver_random_inequalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<double>>,baryonyx::bit_array>
                      ((solver_random_inequalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<double>_>
                        *)this,(int)local_78,x);
    if (!bVar8) {
      details::fail_fast("Precondition","is_valid_constraint(*this, k, x)",
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/random-solver.cpp"
                         ,"335");
    }
    first._M_current = local_50 + 1;
  } while( true );
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        for (; first != last; ++first) {
            auto k = constraint(first);
            bx_expects(k < m);

            auto [row_begin, row_end] = ap.row(k);
            decrease_preference(row_begin, row_end, theta);

            int r_size = 0;
            for (auto it = row_begin; it != row_end; ++it, ++r_size) {
                Float sum_a_p = 0;

                auto [col_begin, col_end] = ap.column(it->column);
                for (; col_begin != col_end; ++col_begin)
                    sum_a_p += static_cast<Float>(A[col_begin->value]) *
                               P[col_begin->value];

                R[r_size].id = r_size;
                R[r_size].a = A[it->value];
                R[r_size].value = c(row_begin->column, x) - sum_a_p;
            }

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);

            int value = 0;
            bool valid = b[k].min <= 0;
            int i = -1;

            // if (!valid) {
            //     do {
            //         ++i;
            //         value += R[i].a;
            //         valid = b[k].min <= value;
            //     } while (!valid && i + 1 < r_size);
            // }

            // valid = b[k].min <= value && value <= b[k].max;
            // while (i + 1 < r_size && valid) {
            //     ++i;
            //     value += R[i].a;
            //     valid = b[k].min <= value && value <= b[k].max;
            // }

            // std::uniform_real_distribution<Float> real_dist(Float{ 0 },
            //                                                 Float{ 1 });

            // auto selected = i;
            // auto d = delta;

            // if (selected < 0) {
            //     d += (kappa / (one - kappa)) * (R[0].value / two);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }
            // } else if (selected + 1 >= r_size) {
            //     d += (kappa / (one - kappa)) * (R[selected].value * middle);
            //     d *= real_dist(rng);

            //     for (i = 0; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }
            // } else {
            //     d += (kappa / (one - kappa)) *
            //          (R[selected + 1].value - R[selected].value);
            //     d *= real_dist(rng);

            //     for (i = 0; i <= selected; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         } else {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         }
            //     }

            //     for (; i != r_size; ++i) {
            //         auto var = row_begin + R[i].id;

            //         if (R[i].is_negative()) {
            //             x.set(var->column, 1);
            //             P[var->value] += d;
            //         } else {
            //             x.set(var->column, 0);
            //             P[var->value] -= d;
            //         }
            //     }

            constexpr Float one{ 1 };
            constexpr Float two{ 2 };

            if (!valid) {
                do {
                    ++i;
                    value += R[i].a;
                    valid = b[k].min <= value;
                    auto var = row_begin + R[i].id;
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } while (!valid && i + 1 < r_size);
            }

            valid = b[k].min <= value && value <= b[k].max;
            while (i + 1 < r_size && valid) {
                ++i;
                value += R[i].a;
                valid = b[k].min <= value && value <= b[k].max;
                auto var = row_begin + R[i].id;

                if (valid)
                    valid = stop_iterating<Mode>(R[i].value, rng);

                if (valid) {
                    x.set(var->column);
                    P[var->value] +=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                } else {
                    x.unset(var->column);
                    P[var->value] -=
                      delta + (kappa / (one - kappa)) * (R[i].value / two);
                }
            }

            while (i + 1 < r_size) {
                ++i;
                auto var = row_begin + R[i].id;
                x.unset(var->column);
                P[var->value] -=
                  delta + (kappa / (one - kappa)) * (R[i].value / two);
            }

            bx_expects(is_valid_constraint(*this, k, x));
        }

        return false;
    }